

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warped_motion.c
# Opt level: O0

int find_affine_int(int np,int *pts1,int *pts2,BLOCK_SIZE bsize,int mvy,int mvx,
                   WarpedMotionParams *wm,int mi_row,int mi_col)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int32_t iVar8;
  long lVar9;
  long Px_00;
  byte in_CL;
  long in_RDX;
  long in_RSI;
  int in_EDI;
  int in_R8D;
  int in_R9D;
  bool bVar10;
  int32_t vy;
  int32_t vx;
  int isux;
  int isuy;
  int64_t Py [2];
  int64_t Px [2];
  int16_t iDet;
  int16_t shift;
  int64_t Det;
  int sy;
  int sx;
  int dy;
  int dx;
  int i;
  int dux;
  int duy;
  int sux;
  int suy;
  int rsux;
  int rsuy;
  int bh;
  int bw;
  int32_t By [2];
  int32_t Bx [2];
  int32_t A [2] [2];
  int16_t *in_stack_ffffffffffffff48;
  uint64_t in_stack_ffffffffffffff50;
  int local_6c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  int local_2c;
  int local_24;
  int local_20;
  byte local_19;
  long local_18;
  long local_10;
  int local_8;
  uint local_4;
  
  local_24 = in_R9D;
  local_20 = in_R8D;
  local_19 = in_CL;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_EDI;
  memset(&local_38,0,0x10);
  memset(&local_40,0,8);
  memset(&local_48,0,8);
  iVar1 = block_size_high[local_19] / 2 - 1;
  iVar2 = block_size_wide[local_19] / 2 - 1;
  for (local_6c = 0; local_6c < local_8; local_6c = local_6c + 1) {
    iVar3 = *(int *)(local_18 + (long)(local_6c << 1) * 4) - (iVar2 * 8 + local_24);
    iVar4 = *(int *)(local_18 + (long)(local_6c * 2 + 1) * 4) - (iVar1 * 8 + local_20);
    iVar5 = *(int *)(local_10 + (long)(local_6c << 1) * 4) + iVar2 * -8;
    iVar6 = *(int *)(local_10 + (long)(local_6c * 2 + 1) * 4) + iVar1 * -8;
    iVar7 = iVar5 - iVar3;
    if (iVar7 < 1) {
      iVar7 = -iVar7;
    }
    if (iVar7 < 0x100) {
      iVar7 = iVar6 - iVar4;
      if (iVar7 < 1) {
        iVar7 = -iVar7;
      }
      if (iVar7 < 0x100) {
        local_38 = (iVar5 * iVar5 * 4 + iVar5 * 0x20 + 0x80 >> 4) + local_38;
        local_34 = (iVar5 * iVar6 * 4 + (iVar5 + iVar6) * 0x10 + 0x40 >> 4) + local_34;
        local_2c = (iVar6 * iVar6 * 4 + iVar6 * 0x20 + 0x80 >> 4) + local_2c;
        local_40 = (iVar5 * iVar3 * 4 + (iVar5 + iVar3) * 0x10 + 0x80 >> 4) + local_40;
        local_3c = (iVar6 * iVar3 * 4 + (iVar6 + iVar3) * 0x10 + 0x40 >> 4) + local_3c;
        local_48 = (iVar5 * iVar4 * 4 + (iVar5 + iVar4) * 0x10 + 0x40 >> 4) + local_48;
        local_44 = (iVar6 * iVar4 * 4 + (iVar6 + iVar4) * 0x10 + 0x80 >> 4) + local_44;
      }
    }
  }
  bVar10 = (long)local_38 * (long)local_2c - (long)local_34 * (long)local_34 != 0;
  if (bVar10) {
    resolve_divisor_64(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    lVar9 = (long)local_2c * (long)local_48 - (long)local_34 * (long)local_44;
    Px_00 = -(long)local_34 * (long)local_48 + (long)local_38 * (long)local_44;
    iVar8 = get_mult_shift_diag(Px_00,(int16_t)((ulong)lVar9 >> 0x30),(int)lVar9);
    _isux[2] = iVar8;
    iVar8 = get_mult_shift_ndiag(Px_00,(int16_t)((ulong)lVar9 >> 0x30),(int)lVar9);
    _isux[3] = iVar8;
    iVar8 = get_mult_shift_ndiag(Px_00,(int16_t)((ulong)lVar9 >> 0x30),(int)lVar9);
    _isux[4] = iVar8;
    iVar8 = get_mult_shift_diag(Px_00,(int16_t)((ulong)lVar9 >> 0x30),(int)lVar9);
    _isux[5] = iVar8;
    iVar1 = (int)Py[0] * 4 + iVar1;
    iVar2 = (int)Py[1] * 4 + iVar2;
    iVar7 = _isux[4];
    iVar3 = _isux[5];
    iVar4 = clamp(local_24 * 0x2000 - (iVar2 * (_isux[2] + -0x10000) + iVar1 * _isux[3]),-0x800000,
                  0x7fffff);
    *_isux = iVar4;
    iVar1 = clamp(local_20 * 0x2000 - (iVar2 * iVar7 + iVar1 * (iVar3 + -0x10000)),-0x800000,
                  0x7fffff);
    _isux[1] = iVar1;
  }
  local_4 = (uint)!bVar10;
  return local_4;
}

Assistant:

static int find_affine_int(int np, const int *pts1, const int *pts2,
                           BLOCK_SIZE bsize, int mvy, int mvx,
                           WarpedMotionParams *wm, int mi_row, int mi_col) {
  int32_t A[2][2] = { { 0, 0 }, { 0, 0 } };
  int32_t Bx[2] = { 0, 0 };
  int32_t By[2] = { 0, 0 };

  const int bw = block_size_wide[bsize];
  const int bh = block_size_high[bsize];
  const int rsuy = bh / 2 - 1;
  const int rsux = bw / 2 - 1;
  const int suy = rsuy * 8;
  const int sux = rsux * 8;
  const int duy = suy + mvy;
  const int dux = sux + mvx;

  // Assume the center pixel of the block has exactly the same motion vector
  // as transmitted for the block. First shift the origin of the source
  // points to the block center, and the origin of the destination points to
  // the block center added to the motion vector transmitted.
  // Let (xi, yi) denote the source points and (xi', yi') denote destination
  // points after origin shfifting, for i = 0, 1, 2, .... n-1.
  // Then if  P = [x0, y0,
  //               x1, y1
  //               x2, y1,
  //                ....
  //              ]
  //          q = [x0', x1', x2', ... ]'
  //          r = [y0', y1', y2', ... ]'
  // the least squares problems that need to be solved are:
  //          [h1, h2]' = inv(P'P)P'q and
  //          [h3, h4]' = inv(P'P)P'r
  // where the affine transformation is given by:
  //          x' = h1.x + h2.y
  //          y' = h3.x + h4.y
  //
  // The loop below computes: A = P'P, Bx = P'q, By = P'r
  // We need to just compute inv(A).Bx and inv(A).By for the solutions.
  // Contribution from neighbor block
  for (int i = 0; i < np; i++) {
    const int dx = pts2[i * 2] - dux;
    const int dy = pts2[i * 2 + 1] - duy;
    const int sx = pts1[i * 2] - sux;
    const int sy = pts1[i * 2 + 1] - suy;
    // (TODO)yunqing: This comparison wouldn't be necessary if the sample
    // selection is done in find_samples(). Also, global offset can be removed
    // while collecting samples.
    if (abs(sx - dx) < LS_MV_MAX && abs(sy - dy) < LS_MV_MAX) {
      A[0][0] += LS_SQUARE(sx);
      A[0][1] += LS_PRODUCT1(sx, sy);
      A[1][1] += LS_SQUARE(sy);
      Bx[0] += LS_PRODUCT2(sx, dx);
      Bx[1] += LS_PRODUCT1(sy, dx);
      By[0] += LS_PRODUCT1(sx, dy);
      By[1] += LS_PRODUCT2(sy, dy);
    }
  }

  // Just for debugging, and can be removed later.
  assert(A[0][0] >= LS_MAT_MIN && A[0][0] <= LS_MAT_MAX);
  assert(A[0][1] >= LS_MAT_MIN && A[0][1] <= LS_MAT_MAX);
  assert(A[1][1] >= LS_MAT_MIN && A[1][1] <= LS_MAT_MAX);
  assert(Bx[0] >= LS_MAT_MIN && Bx[0] <= LS_MAT_MAX);
  assert(Bx[1] >= LS_MAT_MIN && Bx[1] <= LS_MAT_MAX);
  assert(By[0] >= LS_MAT_MIN && By[0] <= LS_MAT_MAX);
  assert(By[1] >= LS_MAT_MIN && By[1] <= LS_MAT_MAX);

  // Compute Determinant of A
  const int64_t Det = (int64_t)A[0][0] * A[1][1] - (int64_t)A[0][1] * A[0][1];
  if (Det == 0) return 1;

  int16_t shift;
  int16_t iDet = resolve_divisor_64(llabs(Det), &shift) * (Det < 0 ? -1 : 1);
  shift -= WARPEDMODEL_PREC_BITS;
  if (shift < 0) {
    iDet <<= (-shift);
    shift = 0;
  }

  int64_t Px[2], Py[2];
  // These divided by the Det, are the least squares solutions
  Px[0] = (int64_t)A[1][1] * Bx[0] - (int64_t)A[0][1] * Bx[1];
  Px[1] = -(int64_t)A[0][1] * Bx[0] + (int64_t)A[0][0] * Bx[1];
  Py[0] = (int64_t)A[1][1] * By[0] - (int64_t)A[0][1] * By[1];
  Py[1] = -(int64_t)A[0][1] * By[0] + (int64_t)A[0][0] * By[1];

  wm->wmmat[2] = get_mult_shift_diag(Px[0], iDet, shift);
  wm->wmmat[3] = get_mult_shift_ndiag(Px[1], iDet, shift);
  wm->wmmat[4] = get_mult_shift_ndiag(Py[0], iDet, shift);
  wm->wmmat[5] = get_mult_shift_diag(Py[1], iDet, shift);

  const int isuy = (mi_row * MI_SIZE + rsuy);
  const int isux = (mi_col * MI_SIZE + rsux);
  // Note: In the vx, vy expressions below, the max value of each of the
  // 2nd and 3rd terms are (2^16 - 1) * (2^13 - 1). That leaves enough room
  // for the first term so that the overall sum in the worst case fits
  // within 32 bits overall.
  const int32_t vx = mvx * (1 << (WARPEDMODEL_PREC_BITS - 3)) -
                     (isux * (wm->wmmat[2] - (1 << WARPEDMODEL_PREC_BITS)) +
                      isuy * wm->wmmat[3]);
  const int32_t vy = mvy * (1 << (WARPEDMODEL_PREC_BITS - 3)) -
                     (isux * wm->wmmat[4] +
                      isuy * (wm->wmmat[5] - (1 << WARPEDMODEL_PREC_BITS)));
  wm->wmmat[0] =
      clamp(vx, -WARPEDMODEL_TRANS_CLAMP, WARPEDMODEL_TRANS_CLAMP - 1);
  wm->wmmat[1] =
      clamp(vy, -WARPEDMODEL_TRANS_CLAMP, WARPEDMODEL_TRANS_CLAMP - 1);
  return 0;
}